

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O3

Maybe<double> __thiscall kj::_::tryParseDouble(_ *this,StringPtr *s)

{
  int *piVar1;
  _ _Var2;
  anon_union_8_1_a8c68091_for_NullableValue<double>_2 in_XMM0_Qa;
  Maybe<double> MVar3;
  char *endPtr;
  char *local_20;
  
  if ((s->content).size_ < 2) {
    *this = (_)0x0;
  }
  else {
    piVar1 = __errno_location();
    *piVar1 = 0;
    in_XMM0_Qa.value = anon_unknown_0::NoLocaleStrtod((s->content).ptr,&local_20);
    _Var2 = (_)(local_20 == (s->content).ptr + ((s->content).size_ - 1));
    if ((bool)_Var2) {
      ((anon_union_8_1_a8c68091_for_NullableValue<double>_2 *)(this + 8))->value =
           (double)in_XMM0_Qa;
    }
    *this = _Var2;
  }
  MVar3.ptr.field_1 = in_XMM0_Qa;
  MVar3.ptr._0_8_ = this;
  return (Maybe<double>)MVar3.ptr;
}

Assistant:

Maybe<double> tryParseDouble(const StringPtr& s) {
  if(s == nullptr) { return kj::none; }
  char *endPtr;
  errno = 0;
  auto value = _::NoLocaleStrtod(s.begin(), &endPtr);
  if (endPtr != s.end()) { return kj::none; }
#if _WIN32 || __CYGWIN__ || __BIONIC__
  if (isNaN(value)) {
    return kj::nan();
  }
#endif
  return value;
}